

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::Constant::Constant(Constant *this,Context *c,Value *v)

{
  Expression::Expression(&this->super_Expression,Constant,c,value);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__Constant_0032dcb0;
  soul::Value::Value(&this->value,v);
  if ((this->value).type.category != invalid) {
    return;
  }
  throwInternalCompilerError("value.isValid()","Constant",0x695);
}

Assistant:

Constant (const Context& c, Value v)
            : Expression (ObjectType::Constant, c, ExpressionKind::value), value (std::move (v))
        {
            SOUL_ASSERT (value.isValid());
        }